

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O1

string * read_shader_code_file(string *__return_storage_ptr__,string *p_path,ShaderType p_type)

{
  long lVar1;
  failure e;
  ifstream ifs;
  undefined1 auStack_3e8 [8];
  long *local_3e0 [2];
  long local_3d0 [2];
  stringstream local_3c0 [16];
  undefined1 local_3b0 [112];
  ios_base local_340 [264];
  long local_238 [2];
  streambuf local_228 [12];
  undefined4 auStack_21c [123];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::ifstream::ifstream(local_238);
  lVar1 = *(long *)(local_238[0] + -0x18);
  *(undefined4 *)((long)auStack_21c + lVar1) = 5;
  std::ios::clear((int)auStack_3e8 + (int)lVar1 + 0x1b0);
  std::ifstream::open((string *)local_238,(_Ios_Openmode)p_path);
  std::__cxx11::stringstream::stringstream(local_3c0);
  std::ostream::operator<<(local_3b0,local_228);
  std::ifstream::close();
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_3e0);
  if (local_3e0[0] != local_3d0) {
    operator_delete(local_3e0[0],local_3d0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_3c0);
  std::ios_base::~ios_base(local_340);
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

std::string read_shader_code_file(
    const std::string &p_path,
    const ShaderType p_type)
{
    std::string content;
    std::ifstream ifs;
    ifs.exceptions(std::ifstream::failbit | std::ifstream::badbit);
    try
    {
        ifs.open(p_path);
        std::stringstream fragment_shader_stream;
        fragment_shader_stream << ifs.rdbuf();
        ifs.close();
        content = fragment_shader_stream.str();
    }
    catch (std::ifstream::failure e)
    {
        std::cerr << "shader file could not be loaded p_path:" << p_path << "\n";
    }
    return content;
}